

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.h
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
ChebTools::ChebyshevCollection::solve_for_x
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,ChebyshevCollection *this
          ,double y)

{
  bool bVar1;
  reference __args;
  double *rt;
  iterator __end3;
  iterator __begin3;
  ChebyshevExpansion local_b0;
  vector<double,_std::allocator<double>_> local_70;
  vector<double,_std::allocator<double>_> *local_58;
  vector<double,_std::allocator<double>_> *__range3;
  reference pCStack_48;
  bool only_in_domain;
  ChebyshevExpansion *ex;
  const_iterator __end2;
  const_iterator __begin2;
  Container *__range2;
  double y_local;
  ChebyshevCollection *this_local;
  vector<double,_std::allocator<double>_> *solns;
  
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  __end2 = std::
           vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>::
           begin(&this->m_exps);
  ex = (ChebyshevExpansion *)
       std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>::
       end(&this->m_exps);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_ChebTools::ChebyshevExpansion_*,_std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>_>
                                     *)&ex), bVar1) {
    pCStack_48 = __gnu_cxx::
                 __normal_iterator<const_ChebTools::ChebyshevExpansion_*,_std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>_>
                 ::operator*(&__end2);
    __range3._7_1_ = 1;
    ChebyshevExpansion::operator-(&local_b0,pCStack_48,y);
    ChebyshevExpansion::real_roots2(&local_70,&local_b0,(bool)(__range3._7_1_ & 1));
    ChebyshevExpansion::~ChebyshevExpansion(&local_b0);
    local_58 = &local_70;
    __end3 = std::vector<double,_std::allocator<double>_>::begin(local_58);
    rt = (double *)std::vector<double,_std::allocator<double>_>::end(local_58);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                       *)&rt), bVar1) {
      __args = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&__end3);
      std::vector<double,std::allocator<double>>::emplace_back<double&>
                ((vector<double,std::allocator<double>> *)__return_storage_ptr__,__args);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&__end3);
    }
    std::vector<double,_std::allocator<double>_>::~vector(&local_70);
    __gnu_cxx::
    __normal_iterator<const_ChebTools::ChebyshevExpansion_*,_std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

auto solve_for_x(double y) const {
            std::vector<double> solns;
            for (auto& ex : m_exps) {
                bool only_in_domain = true;
                for (auto& rt : (ex - y).real_roots2(only_in_domain)) {
                    solns.emplace_back(rt);
                }
            }
            return solns;
        }